

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O0

uint32_t __thiscall
PatchHandleArchipelago::inject_func_boot_init(PatchHandleArchipelago *this,ROM *rom)

{
  size_t this_00;
  uint32_t uVar1;
  allocator<char> local_f1;
  string local_f0;
  Param local_d0 [2];
  Param local_c0 [4];
  Param local_a0 [2];
  undefined1 local_90 [8];
  Code func;
  ROM *rom_local;
  PatchHandleArchipelago *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_90);
  addr_<void>((uint32_t)local_a0,0xff0020);
  md::Code::moveb((Code *)local_90,0xff,local_a0);
  uVar1 = this->_seed;
  addr_<void>((uint32_t)local_c0,0xff0022);
  md::Code::movel((Code *)local_90,uVar1,local_c0);
  addr_<void>((uint32_t)local_d0,0xff107e);
  md::Code::movew((Code *)local_90,0,local_d0);
  md::Code::jsr((Code *)local_90,0x230);
  md::Code::rts((Code *)local_90);
  this_00 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  uVar1 = md::ROM::inject_code((ROM *)this_00,(Code *)local_90,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

uint32_t inject_func_boot_init(md::ROM& rom) const
    {
        md::Code func;
        {
            func.moveb(0xFF, addr_(ADDR_ARCHIPELAGO_RECEIVED_ITEM));
            func.movel(_seed, addr_(ADDR_ARCHIPELAGO_SEED));
            func.movew(0x0000, addr_(ADDR_CURRENT_RECEIVED_ITEM_INDEX));
        }
        func.jsr(0x230); // call j_DisableDisplayAndInts whose call was replaced by this function
        func.rts();
        return rom.inject_code(func);
    }